

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Reader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::BP3Reader::InitBuffer(BP3Reader *this)

{
  BP3Deserializer *this_00;
  TransportMan *this_01;
  size_t sVar1;
  size_t size;
  long lVar2;
  ulong __val;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  size_t local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->m_BP3Deserializer;
  lVar2 = *(long *)(*(long *)&this->m_BP3Deserializer + -0x18);
  if (*(int *)((long)&(this->m_BP3Deserializer).m_Minifooter.VersionTag._M_string_length + lVar2) ==
      0) {
    this_01 = &this->m_FileManager;
    sVar1 = transportman::TransportMan::GetFileSize(this_01,0);
    __val = (ulong)*(uint *)(&(this->m_BP3Deserializer).field_0x198 +
                            *(long *)(*(long *)&this->m_BP3Deserializer + -0x18));
    if (sVar1 < __val) {
      std::operator+(&local_50,"The size of the input file ",&(this->super_Engine).m_Name);
      std::operator+(&local_110,&local_50,"(");
      std::__cxx11::to_string(&local_70,sVar1);
      std::operator+(&local_f0,&local_110,&local_70);
      std::operator+(&local_150,&local_f0,
                     " bytes) is less than the minimum BP3 header size, which is ");
      std::__cxx11::to_string(&local_90,__val);
      std::operator+(&local_130,&local_150,&local_90);
      std::operator+(&local_178,&local_130," bytes.");
      std::operator+(&err,&local_178," It is unlikely that this is a .bp file.");
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::string((string *)&local_178,"Engine",(allocator *)&local_f0);
      std::__cxx11::string::string((string *)&local_130,"BP3Reader",(allocator *)&local_110);
      std::__cxx11::string::string((string *)&local_150,"Init",(allocator *)&local_50);
      helper::Throw<std::logic_error>(&local_178,&local_130,&local_150,&err,-1);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&err);
    }
    std::__cxx11::string::string
              ((string *)&err," fileSize < miniFooterSize, in call to Open",(allocator *)&local_178)
    ;
    local_158 = sVar1;
    sVar1 = helper::GetDistance(sVar1,__val,&err);
    std::__cxx11::string::~string((string *)&err);
    lVar2 = *(long *)(*(long *)this_00 + -0x18);
    std::__cxx11::string::string
              ((string *)&local_b0,
               "allocating metadata buffer to inspect bp minifooter, in call to Open",
               (allocator *)&err);
    adios2::format::BufferSTL::Resize((BufferSTL *)(&this_00->field_0x88 + lVar2),__val,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    transportman::TransportMan::ReadFile
              (this_01,*(char **)(&(this->m_BP3Deserializer).field_0xc8 +
                                 *(long *)(*(long *)this_00 + -0x18)),__val,sVar1,0);
    sVar1 = adios2::format::BP3Deserializer::MetadataStart
                      (this_00,(BufferSTL *)
                               (&this_00->field_0x88 + *(long *)(*(long *)this_00 + -0x18)));
    std::__cxx11::string::string
              ((string *)&err," fileSize < miniFooterSize, in call to Open",(allocator *)&local_178)
    ;
    size = helper::GetDistance(local_158,sVar1,&err);
    std::__cxx11::string::~string((string *)&err);
    lVar2 = *(long *)(*(long *)this_00 + -0x18);
    std::__cxx11::string::string
              ((string *)&local_d0,"allocating metadata buffer, in call to Open",(allocator *)&err);
    adios2::format::BufferSTL::Resize((BufferSTL *)(&this_00->field_0x88 + lVar2),size,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    transportman::TransportMan::ReadFile
              (this_01,*(char **)(&(this->m_BP3Deserializer).field_0xc8 +
                                 *(long *)(*(long *)this_00 + -0x18)),size,sVar1,0);
    lVar2 = *(long *)(*(long *)this_00 + -0x18);
  }
  helper::Comm::BroadcastVector<char>
            (&(this->super_Engine).m_Comm,
             (vector<char,_std::allocator<char>_> *)(&this_00->field_0xc8 + lVar2),0);
  adios2::format::BP3Deserializer::ParseMetadata
            (this_00,(BufferSTL *)
                     (&this_00->field_0x88 + *(long *)(*(long *)&this->m_BP3Deserializer + -0x18)),
             &this->super_Engine);
  IO::SetPrefixedNames((this->super_Engine).m_IO,false);
  return;
}

Assistant:

void BP3Reader::InitBuffer()
{
    if (m_BP3Deserializer.m_RankMPI == 0)
    {
        const size_t fileSize = m_FileManager.GetFileSize();
        // handle single bp files from ADIOS 1.x by getting onl the metadata in
        // buffer

        // Load/Read Minifooter
        const size_t miniFooterSize = m_BP3Deserializer.m_MetadataSet.MiniFooterSize;
        if (fileSize < miniFooterSize)
        {
            std::string err = "The size of the input file " + m_Name + "(" +
                              std::to_string(fileSize) +
                              " bytes) is less than the minimum BP3 header "
                              "size, which is " +
                              std::to_string(miniFooterSize) + " bytes." +
                              " It is unlikely that this is a .bp file.";
            helper::Throw<std::logic_error>("Engine", "BP3Reader", "Init", err);
        }
        const size_t miniFooterStart = helper::GetDistance(
            fileSize, miniFooterSize, " fileSize < miniFooterSize, in call to Open");

        m_BP3Deserializer.m_Metadata.Resize(
            miniFooterSize, "allocating metadata buffer to inspect bp minifooter, in call to "
                            "Open");

        m_FileManager.ReadFile(m_BP3Deserializer.m_Metadata.m_Buffer.data(), miniFooterSize,
                               miniFooterStart);

        // Load/Read Metadata
        const size_t metadataStart = m_BP3Deserializer.MetadataStart(m_BP3Deserializer.m_Metadata);
        const size_t metadataSize = helper::GetDistance(
            fileSize, metadataStart, " fileSize < miniFooterSize, in call to Open");

        m_BP3Deserializer.m_Metadata.Resize(metadataSize,
                                            "allocating metadata buffer, in call to Open");

        m_FileManager.ReadFile(m_BP3Deserializer.m_Metadata.m_Buffer.data(), metadataSize,
                               metadataStart);
    }

    // broadcast metadata buffer to all ranks from zero
    m_Comm.BroadcastVector(m_BP3Deserializer.m_Metadata.m_Buffer);

    // fills IO with available Variables and Attributes
    m_BP3Deserializer.ParseMetadata(m_BP3Deserializer.m_Metadata, *this);
    // caches attributes associated with variables
    m_IO.SetPrefixedNames(false);
}